

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O0

int dozap(obj *obj)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  char local_128 [8];
  char buf [256];
  schar local_1f;
  schar local_1e;
  schar local_1d;
  int local_1c;
  schar dz;
  schar dy;
  schar dx;
  obj *poStack_18;
  int damage;
  obj *obj_local;
  
  local_1d = '\0';
  local_1e = '\0';
  local_1f = '\0';
  poStack_18 = obj;
  bVar1 = check_capacity((char *)0x0);
  if (bVar1 == '\0') {
    if ((poStack_18 == (obj *)0x0) ||
       (bVar1 = validate_object(poStack_18,"\v","zap"), bVar1 != '\0')) {
      if (poStack_18 == (obj *)0x0) {
        poStack_18 = getobj("\v","zap",(obj **)0x0);
      }
      if (poStack_18 == (obj *)0x0) {
        obj_local._4_4_ = 0;
      }
      else {
        check_unpaid(poStack_18);
        iVar2 = zappable(poStack_18);
        if (iVar2 != 0) {
          if (((*(uint *)&poStack_18->field_0x4a & 1) != 0) && (iVar2 = rn2(0x1e), iVar2 == 0)) {
            backfire(poStack_18);
            exercise(0,'\0');
            return 1;
          }
          if (((*(ushort *)&objects[poStack_18->otyp].field_0x11 >> 2 & 3) == 1) ||
             (iVar2 = getdir((char *)0x0,&local_1d,&local_1e,&local_1f), iVar2 != 0)) {
            if ((local_1d == '\0') &&
               (((local_1e == '\0' && (local_1f == '\0')) &&
                ((*(ushort *)&objects[poStack_18->otyp].field_0x11 >> 2 & 3) != 1)))) {
              local_1c = zapyourself(poStack_18,'\x01');
              if (local_1c != 0) {
                sprintf(local_128,"zapped %sself with a wand",
                        genders[(int)(uint)(flags.female != '\0')].him);
                losehp(local_1c,local_128,2);
              }
            }
            else {
              current_wand = poStack_18;
              weffects(poStack_18,local_1d,local_1e,local_1f);
              poStack_18 = current_wand;
              current_wand = (obj *)0x0;
            }
          }
          else if ((((u.uprops[0x1e].intrinsic == 0) &&
                    ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                   (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                  ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            pcVar3 = xname(poStack_18);
            pcVar3 = The(pcVar3);
            pline("%s glows and fades.",pcVar3);
          }
        }
        if ((poStack_18 != (obj *)0x0) && (poStack_18->spe < '\0')) {
          pcVar3 = Tobjnam(poStack_18,"turn");
          pline("%s to dust.",pcVar3);
          useup(poStack_18);
        }
        update_inventory();
        obj_local._4_4_ = 1;
      }
    }
    else {
      obj_local._4_4_ = 0;
    }
  }
  else {
    obj_local._4_4_ = 0;
  }
  return obj_local._4_4_;
}

Assistant:

int dozap(struct obj *obj)
{
	int	damage;
	schar dx = 0, dy = 0, dz = 0;

	if (check_capacity(NULL)) return 0;
	
	if (obj && !validate_object(obj, zap_syms, "zap"))
		return 0;
	else if (!obj)
		obj = getobj(zap_syms, "zap", NULL);
	if (!obj) return 0;

	check_unpaid(obj);

	/* zappable addition done by GAN 11/03/86 */
	if (!zappable(obj)) { /* zappable prints the message itself */ }
	/* PM 2008-04-16: 50% chance of blowing up, if zapped 20 times.
	 * Same probability as in muse.c precheck() for monsters. */
	else if (obj->cursed && !rn2(30)) {
		backfire(obj);	/* the wand blows up in your face! */
		exercise(A_STR, FALSE);
		return 1;
	} else if (!(objects[obj->otyp].oc_dir == NODIR) &&
	           !getdir(NULL, &dx, &dy, &dz)) {
		if (!Blind)
		    pline("%s glows and fades.", The(xname(obj)));
		/* make him pay for knowing !NODIR */
	} else if (!dx && !dy && !dz && !(objects[obj->otyp].oc_dir == NODIR)) {
	    if ((damage = zapyourself(obj, TRUE)) != 0) {
		char buf[BUFSZ];
		sprintf(buf, "zapped %sself with a wand", uhim());
		losehp(damage, buf, NO_KILLER_PREFIX);
	    }
	} else {

		/*	Are we having fun yet?
		 * weffects -> buzz(obj->otyp) -> zhitm (temple priest) ->
		 * attack -> hitum -> known_hitum -> ghod_hitsu ->
		 * buzz(AD_ELEC) -> destroy_item(WAND_CLASS) ->
		 * useup -> obfree -> dealloc_obj -> free(obj)
		 */
		current_wand = obj;
		weffects(obj, dx, dy, dz);
		obj = current_wand;
		current_wand = 0;
	}
	if (obj && obj->spe < 0) {
	    pline("%s to dust.", Tobjnam(obj, "turn"));
	    useup(obj);
	}
	update_inventory();	/* maybe used a charge */
	return 1;
}